

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

void __thiscall Device::reset(Device *this)

{
  uint32_t value;
  uint32_t addr;
  
  switch(this->_family) {
  case FAMILY_SAM7S:
  case FAMILY_SAM7SE:
  case FAMILY_SAM7X:
  case FAMILY_SAM7XC:
  case FAMILY_SAM7L:
  case FAMILY_SAM9XE:
    value = 0xa500000d;
    addr = 0xfffffd00;
    break;
  case FAMILY_SAM3N:
  case FAMILY_SAM4S:
    value = 0xa500000d;
    addr = 0x400e1400;
    break;
  case FAMILY_SAM3S:
  case FAMILY_SAM3X:
  case FAMILY_SAM3A:
    value = 0xa500000d;
    addr = 0x400e1a00;
    break;
  case FAMILY_SAM3U:
    value = 0xa500000d;
    addr = 0x400e1200;
    break;
  case FAMILY_SAM4E:
    value = 0xa500000d;
    addr = 0x400e1800;
    break;
  case FAMILY_SAMD21:
  case FAMILY_SAMR21:
  case FAMILY_SAML21:
  case FAMILY_SAMD51:
  case FAMILY_SAME51:
  case FAMILY_SAME53:
  case FAMILY_SAME54:
  case FAMILY_SAME70:
  case FAMILY_SAMS70:
  case FAMILY_SAMV70:
  case FAMILY_SAMV71:
    value = 0x5fa0004;
    addr = 0xe000ed0c;
    break;
  case FAMILY_IMRXT:
    Samba::go(this->_samba);
  default:
    goto switchD_00109e15_default;
  }
  Samba::writeWord(this->_samba,addr,value);
switchD_00109e15_default:
  return;
}

Assistant:

void
Device::reset()
{
    try
    {
        switch (_family)
        {
        case FAMILY_SAMD21:
        case FAMILY_SAMR21:
        case FAMILY_SAML21:
        case FAMILY_SAMD51:
        case FAMILY_SAME51:
        case FAMILY_SAME53:
        case FAMILY_SAME54:
        case FAMILY_SAME70:
        case FAMILY_SAMS70:
        case FAMILY_SAMV70:
        case FAMILY_SAMV71:
            _samba.writeWord(0xE000ED0C, 0x05FA0004);
            break;

        case FAMILY_SAM3X:
        case FAMILY_SAM3S:
        case FAMILY_SAM3A:
            _samba.writeWord(0x400E1A00, 0xA500000D);
            break;

        case FAMILY_SAM3U:
            _samba.writeWord(0x400E1200, 0xA500000D);
            break;

        case FAMILY_SAM3N:
        case FAMILY_SAM4S:
            _samba.writeWord(0x400E1400, 0xA500000D);
            break;

        case FAMILY_SAM4E:
            _samba.writeWord(0x400E1800, 0xA500000D);
            break;

        case FAMILY_SAM7S:
        case FAMILY_SAM7SE:
        case FAMILY_SAM7X:
        case FAMILY_SAM7XC:
        case FAMILY_SAM7L:
        case FAMILY_SAM9XE:
            _samba.writeWord(0xFFFFFD00, 0xA500000D);
            break;
        case FAMILY_IMRXT:
            _samba.go(0x60000000);
            break;
        default:
            break;
        }
    }
    catch (std::exception& expected)
    {   // writeWord will most likely throw an exception when the CPU is reset
    }
}